

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O1

void destroy_expectation(RecordedExpectation *expectation)

{
  destroy_cgreen_vector(expectation->constraints);
  expectation->test_line = 0;
  expectation->time_to_live = 0;
  expectation->constraints = (CgreenVector *)0x0;
  expectation->function = (char *)0x0;
  expectation->test_file = (char *)0x0;
  expectation->number_times_called = 0;
  expectation->times_triggered = 0;
  free(expectation);
  return;
}

Assistant:

static void destroy_expectation(RecordedExpectation *expectation) {
    destroy_cgreen_vector(expectation->constraints);
    expectation->constraints = NULL;
    expectation->function = NULL;
    expectation->test_file = NULL;
    expectation->test_line = 0;
    expectation->time_to_live = 0;
    expectation->number_times_called = 0;
    expectation->times_triggered = 0;

    free(expectation);
}